

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O0

TRIPLEYCbCr **
gradationalTransformation(TRIPLEYCbCr **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *__s;
  void *pvVar3;
  ulong uVar4;
  TRIPLEYCbCr **ppTVar5;
  TRIPLEYCbCr *pTVar6;
  int local_60;
  int local_5c;
  int j_2;
  int i_2;
  TRIPLEYCbCr **mrxGrad;
  int local_48;
  int j_1;
  int sum;
  int i_1;
  uint8_t *s;
  int j;
  int i;
  int w;
  int h;
  int *n;
  TRIPLEYCbCr **mrx_local;
  BITMAPFILEHEADER bmFile_local;
  
  __s = operator_new__(0x400);
  memset(__s,0,0x400);
  for (s._4_4_ = 0; s._4_4_ < (int)bmInfo.biHeight; s._4_4_ = s._4_4_ + 1) {
    for (s._0_4_ = 0; (int)s < (int)bmInfo.biWidth; s._0_4_ = (int)s + 1) {
      *(int *)((long)__s + (ulong)mrx[s._4_4_][(int)s].Y * 4) =
           *(int *)((long)__s + (ulong)mrx[s._4_4_][(int)s].Y * 4) + 1;
    }
  }
  pvVar3 = operator_new__(0x100);
  for (j_1 = 0; j_1 < 0x100; j_1 = j_1 + 1) {
    local_48 = 0;
    for (mrxGrad._4_4_ = 0; mrxGrad._4_4_ < j_1; mrxGrad._4_4_ = mrxGrad._4_4_ + 1) {
      local_48 = *(int *)((long)__s + (long)mrxGrad._4_4_ * 4) + local_48;
    }
    *(char *)((long)pvVar3 + (long)j_1) =
         (char)(int)((double)local_48 * (255.0 / (double)(int)(bmInfo.biHeight * bmInfo.biWidth)));
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)bmInfo.biHeight;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppTVar5 = (TRIPLEYCbCr **)operator_new__(uVar4);
  for (local_5c = 0; local_5c < (int)bmInfo.biHeight; local_5c = local_5c + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)bmInfo.biWidth;
    uVar4 = SUB168(auVar2 * ZEXT816(3),0);
    if (SUB168(auVar2 * ZEXT816(3),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pTVar6 = (TRIPLEYCbCr *)operator_new__(uVar4);
    ppTVar5[local_5c] = pTVar6;
    for (local_60 = 0; local_60 < (int)bmInfo.biWidth; local_60 = local_60 + 1) {
      ppTVar5[local_5c][local_60].Y = *(uchar *)((long)pvVar3 + (ulong)mrx[local_5c][local_60].Y);
    }
  }
  return ppTVar5;
}

Assistant:

TRIPLEYCbCr **gradationalTransformation(TRIPLEYCbCr **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo) {
    int *n = new int[256];
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    memset(n, 0, sizeof(int) * 256);
    for (int i = 0; i < h; i++) {
        for (int j = 0; j < w; j++) {
            n[mrx[i][j].Y]++;
        }
    }

    uint8_t *s = new uint8_t[256];
    for (int i = 0; i < 256; i++) {
        int sum = 0;
        for (int j = 0; j < i; j++) {
            sum += n[j];
        }
        s[i] = (uint8_t) (sum * ((double) 255 / (h * w)));
    }
    TRIPLEYCbCr **mrxGrad = new TRIPLEYCbCr *[h];
    for (int i = 0; i < h; i++) {
        mrxGrad[i] = new TRIPLEYCbCr[w];
        for (int j = 0; j < w; j++) {
            mrxGrad[i][j].Y = s[mrx[i][j].Y];
        }
    }
    return mrxGrad;
}